

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O3

int ON_SolveQuadraticEquation(double a,double b,double c,double *r0,double *r1)

{
  double dVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  if ((a == 0.0) && (!NAN(a))) {
    if ((b == 0.0) && (!NAN(b))) {
      *r1 = 0.0;
      *r0 = 0.0;
      return -2 - (uint)(c == 0.0);
    }
    *r1 = -c / b;
    *r0 = -c / b;
    return -1;
  }
  if ((c != 0.0) || (NAN(c))) {
    if ((b != 0.0) || (NAN(b))) {
      dVar6 = a * -4.0 * c + b * b;
      dVar4 = ABS(dVar6);
      dVar5 = b * b * 2.220446049250313e-16;
      dVar6 = (double)(-(ulong)(dVar5 < dVar4) & (ulong)dVar6);
      if (dVar6 <= 0.0) {
        dVar1 = (b * -0.5) / a;
        *r0 = dVar1;
        if ((dVar6 != 0.0) || (NAN(dVar6))) {
          dVar5 = ABS((SQRT((double)(-(ulong)(dVar5 < dVar4) & (ulong)dVar4)) * 0.5) / a);
          *r1 = dVar5;
          dVar6 = *r0;
          dVar4 = (a * dVar6 + b) * dVar6 + c;
          if (((a <= 0.0) || (0.0 < dVar4)) &&
             ((((0.0 <= a || (dVar4 < 0.0)) && (ABS(dVar4 - dVar5 * a * dVar5) < ABS(dVar4))) &&
              (ABS(dVar5 * ((a + a) * dVar6 + b)) < ABS(dVar4))))) {
            return 2;
          }
          *r1 = dVar6;
        }
        else {
          *r1 = dVar1;
        }
      }
      else {
        if (dVar6 < 0.0) {
          dVar6 = sqrt(dVar6);
        }
        else {
          dVar6 = SQRT(dVar6);
        }
        dVar6 = (ABS(b) + dVar6) * 0.5;
        auVar7._0_8_ = -(ulong)(0.0 < b) & (ulong)-dVar6 | ~-(ulong)(0.0 < b) & (ulong)dVar6;
        auVar7._8_8_ = c;
        auVar8._8_4_ = (int)auVar7._0_8_;
        auVar8._0_8_ = a;
        auVar8._12_4_ = (int)(auVar7._0_8_ >> 0x20);
        auVar8 = divpd(auVar7,auVar8);
        dVar5 = auVar8._8_8_;
        uVar2 = auVar8._8_4_;
        uVar3 = auVar8._12_4_;
        dVar6 = auVar8._0_8_;
        if ((dVar6 != dVar5) || (NAN(dVar6) || NAN(dVar5))) {
          if (dVar6 <= dVar5) {
            uVar2 = auVar8._0_4_;
            uVar3 = auVar8._4_4_;
            dVar6 = dVar5;
          }
          dVar5 = (b * -0.5) / a;
          if (((double)CONCAT44(uVar3,uVar2) <= dVar5) && (dVar5 <= dVar6)) {
            dVar4 = (a * dVar5 + b) * dVar5 + c;
            if (((ABS(dVar4) <=
                  ABS((a * (double)CONCAT44(uVar3,uVar2) + b) * (double)CONCAT44(uVar3,uVar2) + c))
                || (ABS(dVar4) <= ABS((a * dVar6 + b) * dVar6 + c))) ||
               (((0.0 < a && (0.0 < dVar4)) || ((a < 0.0 && (dVar4 < 0.0)))))) {
              *r1 = dVar5;
              *r0 = dVar5;
              return 1;
            }
          }
          *r0 = (double)CONCAT44(uVar3,uVar2);
          *r1 = dVar6;
          return 0;
        }
        *r1 = dVar6;
        *r0 = dVar6;
      }
      return 1;
    }
    dVar6 = SQRT(ABS(c / -a));
    *r1 = dVar6;
    if (c / -a < 0.0) {
      *r0 = 0.0;
      return 2;
    }
    *r0 = -dVar6;
  }
  else {
    if ((b == 0.0) && (!NAN(b))) {
      *r1 = 0.0;
      *r0 = 0.0;
      return 1;
    }
    dVar4 = b / -a;
    dVar5 = 0.0;
    dVar6 = dVar4;
    if (0.0 <= dVar4) {
      dVar6 = 0.0;
      dVar5 = dVar4;
    }
    *r0 = dVar6;
    *r1 = dVar5;
  }
  return 0;
}

Assistant:

int
ON_SolveQuadraticEquation(
       double a, double b, double c, 
       double *r0, double *r1
       )
/* Find solutions of a quadratic equation
 *
 * INPUT:
 *   a, b, c  coefficients defining the quadratic equation
 *            a*t^2 + b*t + c = 0
 *   r0, r1   address of doubles
 * OUTPUT:
 *   ON_QuadraticEquation()
 *      0: successful - two distinct real roots (*r0 < *r1)
 *      1: successful - one real root (*r0 = *r1)
 *      2: successful - two complex conjugate roots (*r0 +/- (*r1)*sqrt(-1))
 *     -1: failure - a = 0, b != 0        (*r0 = *r1 = -c/b)
 *     -2: failure - a = 0, b  = 0 c != 0 (*r0 = *r1 = 0.0)
 *     -3: failure - a = 0, b  = 0 c  = 0 (*r0 = *r1 = 0.0)
 *
 * COMMENTS:
 *   The quadratic equation is solved using the formula
 *   roots = q/a, c/q, q = 0.5*(b + sgn(b)*sqrt(b^2 - 4ac)).
 *
 *   When |b^2 - 4*a*c| <= b*b*ON_EPSILON, the discriminant
 *   is numerical noise and is assumed to be zero.
 *
 *   If it is really important to have the best possible answer,
 *   you should probably tune up the returned roots using
 *   Brent's algorithm.
 *
 * REFERENCE:
 *   Numerical Recipes in C, section 5.5
 *
 * RELATED FUNCTIONS:
 *   ON_CubicEquation()
 */
{
  double q, x0, x1, y0, y1, y;

  if (a == 0.0) {
    if (b == 0.0) 
      {*r0 = *r1 = 0.0; return (c == 0.0) ? -3 : -2;}
    *r0 = *r1 = -c/b; return -1;
  }

  if (c == 0.0) {
    if (b == 0.0) 
      {*r0 = *r1 = 0.0; return 1;}
    b /= -a;
    if (b < 0.0) 
      {*r0=b;*r1=0.0;} 
    else
      {*r0=0.0;*r1=b;}
    return 0;
  }

  if (b == 0.0) {
    c /= -a;
    *r1 = sqrt(fabs(c));
    if (c < 0.0) 
      {*r0 = 0.0; return 2;}
    *r0 = -(*r1);
    return 0;
  }
  q = b*b - 4.0*a*c;
  if (fabs(q) <= b*b* ON_EPSILON) 
    q = 0.0; /* q is noise - set it to zero */
  if (q <= 0.0) {
    /* multiple real root or complex conjugate roots */
    *r0 = -0.5*b/a;
    if (q == 0.0) 
      {*r1 = *r0; return 1;}

    /* complex conjugate roots (probably) */
    *r1 = fabs(0.5*sqrt(fabs(q))/a); 
    x0 = *r0;
    x1 = *r1;
    y = (a*x0 + b)*x0 + c;            /* y = quadratic evaluated at -b/2a */
    if ((a > 0.0 && y <= 0.0) || (a < 0.0 && y >= 0.0))
      {*r1 = *r0; return 1;}
    y0 = y - a*x1*x1;                 /* y0 = real part of "zero" */
    y1 = (2.0*a*x0 + b)*x1;           /* y1 = imaginary part of "zero" */
    if (fabs(y) <= fabs(y0) || fabs(y) <= fabs(y1)) 
      {*r1 = *r0; return 1;}
    return 2;
  }

  /* distinct roots (probably) */
  q = 0.5*(fabs(b) + sqrt(q));
  if (b > 0.0) q = -q;
  x0 = q/a;
  x1 = c/q;
  if (x0 == x1) 
    {*r0 = *r1 = x0; return 1;}

  if (x0 > x1) 
    {y = x0; x0 = x1; x1 = y;}

  /* quick test to see if roots are numerically distinct from extrema */
  y = -0.5*b/a;
  if (x0 <= y && y <= x1) {
    y = (a*y + b)*y + c;              /* y = quadratic evaluated at -b/2a */
    y0 = (a*x0 + b)*x0 + c;
    y1 = (a*x1 + b)*x1 + c;
    if (fabs(y) <= fabs(y0) || fabs(y) <= fabs(y1)
        || (a > 0.0 && y > 0.0) || (a < 0.0 && y < 0.0))
      {*r0 = *r1 = -0.5*b/a; return 1;}
  }

  /* distinct roots */
  *r0 = x0;
  *r1 = x1;
  return 0;
}